

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O1

void __thiscall
gss::innards::HomomorphismModel::_build_distance3_graphs
          (HomomorphismModel *this,
          vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *graph_rows,
          uint size,uint *idx,bool pattern)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  pointer pSVar3;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var4;
  byte bVar5;
  ulong uVar6;
  SVOBitset *pSVar7;
  undefined8 uVar8;
  _List_node_base *p_Var9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  BitWord BVar14;
  uint uVar15;
  value_type nv;
  value_type nc;
  undefined1 local_140 [128];
  uint local_c0;
  anon_union_128_2_84168a9f_for__data local_b8;
  uint local_38;
  
  if (size == 0) {
LAB_00135a1d:
    if (pattern) {
      _Var4._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      p_Var2 = (_List_node_base *)(local_140 + 0x10);
      local_140._0_8_ = p_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"distance3","");
      p_Var9 = (_List_node_base *)operator_new(0x30);
      p_Var9[1]._M_next = p_Var9 + 2;
      if ((_List_node_base *)local_140._0_8_ == p_Var2) {
        p_Var9[2]._M_next = (_List_node_base *)CONCAT71(local_140._17_7_,local_140[0x10]);
        p_Var9[2]._M_prev = (_List_node_base *)local_140._24_8_;
      }
      else {
        p_Var9[1]._M_next = (_List_node_base *)local_140._0_8_;
        p_Var9[2]._M_next = (_List_node_base *)CONCAT71(local_140._17_7_,local_140[0x10]);
      }
      p_Var9[1]._M_prev = (_List_node_base *)local_140._8_8_;
      local_140._8_8_ = 0;
      local_140[0x10] = 0;
      local_140._0_8_ = p_Var2;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = (size_t *)((long)&(_Var4._M_head_impl)->supplemental_graph_names + 0x10);
      *psVar1 = *psVar1 + 1;
      if ((_List_node_base *)local_140._0_8_ != p_Var2) {
        operator_delete((void *)local_140._0_8_,CONCAT71(local_140._17_7_,local_140[0x10]) + 1);
      }
    }
    *idx = *idx + 1;
    return;
  }
  uVar15 = 0;
  do {
    SVOBitset::SVOBitset
              ((SVOBitset *)local_140,
               (graph_rows->
               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
               )._M_impl.super__Vector_impl_data._M_start + this->max_graphs * uVar15);
    SVOBitset::operator|=
              ((graph_rows->
               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
               )._M_impl.super__Vector_impl_data._M_start + (this->max_graphs * uVar15 + *idx),
               (SVOBitset *)local_140);
    uVar6 = (ulong)local_c0;
    pSVar7 = (SVOBitset *)local_140;
    if (0x10 < uVar6) {
      pSVar7 = (SVOBitset *)local_140._0_8_;
    }
    iVar10 = -1;
    if (uVar6 != 0) {
      lVar12 = 0;
      do {
        BVar14 = (pSVar7->_data).short_data[0];
        if (BVar14 != 0) goto LAB_001359ea;
        lVar12 = lVar12 + -0x40;
        pSVar7 = (SVOBitset *)((long)&pSVar7->_data + 8);
      } while (uVar6 * 0x40 + lVar12 != 0);
    }
LAB_0013580f:
    while (iVar10 != -1) {
      pSVar7 = (SVOBitset *)local_140;
      if (0x10 < local_c0) {
        pSVar7 = (SVOBitset *)local_140._0_8_;
      }
      bVar5 = (byte)iVar10 & 0x3f;
      iVar11 = iVar10 + 0x3f;
      if (-1 < iVar10) {
        iVar11 = iVar10;
      }
      (pSVar7->_data).short_data[iVar11 >> 6] =
           (pSVar7->_data).short_data[iVar11 >> 6] &
           (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      SVOBitset::SVOBitset
                ((SVOBitset *)&local_b8,
                 (graph_rows->
                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                 )._M_impl.super__Vector_impl_data._M_start + iVar10 * this->max_graphs);
      SVOBitset::operator|=
                ((graph_rows->
                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                 )._M_impl.super__Vector_impl_data._M_start + (this->max_graphs * uVar15 + *idx),
                 (SVOBitset *)&local_b8);
      uVar6 = (ulong)local_38;
      uVar8 = &local_b8;
      if (0x10 < uVar6) {
        uVar8 = local_b8.short_data[0];
      }
      iVar10 = -1;
      if (uVar6 != 0) {
        lVar12 = 0;
        do {
          uVar13 = *(ulong *)uVar8;
          if (uVar13 != 0) goto LAB_0013597c;
          lVar12 = lVar12 + -0x40;
          uVar8 = uVar8 + 8;
        } while (uVar6 * 0x40 + lVar12 != 0);
      }
LAB_001358c7:
      while (iVar10 != -1) {
        uVar8 = &local_b8;
        if (0x10 < local_38) {
          uVar8 = local_b8.long_data;
        }
        bVar5 = (byte)iVar10 & 0x3f;
        iVar11 = iVar10 + 0x3f;
        if (-1 < iVar10) {
          iVar11 = iVar10;
        }
        *(ulong *)(uVar8 + (long)(iVar11 >> 6) * 8) =
             *(ulong *)(uVar8 + (long)(iVar11 >> 6) * 8) &
             (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        pSVar3 = (graph_rows->
                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        SVOBitset::operator|=
                  (pSVar3 + (this->max_graphs * uVar15 + *idx),pSVar3 + iVar10 * this->max_graphs);
        uVar6 = (ulong)local_38;
        uVar8 = &local_b8;
        if (0x10 < uVar6) {
          uVar8 = local_b8.long_data;
        }
        iVar10 = -1;
        if (uVar6 != 0) {
          lVar12 = 0;
          do {
            uVar13 = *(ulong *)uVar8;
            if (uVar13 != 0) goto LAB_0013597c;
            lVar12 = lVar12 + -0x40;
            uVar8 = uVar8 + 8;
          } while (uVar6 * 0x40 + lVar12 != 0);
        }
      }
      if ((0x10 < local_38) &&
         ((anon_union_128_2_84168a9f_for__data *)local_b8.short_data[0] !=
          (anon_union_128_2_84168a9f_for__data *)0x0)) {
        operator_delete__(local_b8.long_data);
      }
      uVar6 = (ulong)local_c0;
      pSVar7 = (SVOBitset *)local_140;
      if (0x10 < uVar6) {
        pSVar7 = (SVOBitset *)local_140._0_8_;
      }
      iVar10 = -1;
      if (uVar6 != 0) {
        lVar12 = 0;
        do {
          BVar14 = (pSVar7->_data).short_data[0];
          if (BVar14 != 0) goto LAB_001359ea;
          lVar12 = lVar12 + -0x40;
          pSVar7 = (SVOBitset *)((long)&pSVar7->_data + 8);
        } while (uVar6 * 0x40 + lVar12 != 0);
      }
    }
    if ((0x10 < local_c0) && ((SVOBitset *)local_140._0_8_ != (SVOBitset *)0x0)) {
      operator_delete__((void *)local_140._0_8_);
    }
    uVar15 = uVar15 + 1;
    if (uVar15 == size) goto LAB_00135a1d;
  } while( true );
LAB_0013597c:
  iVar10 = 0;
  for (; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
    iVar10 = iVar10 + 1;
  }
  iVar10 = iVar10 - (int)lVar12;
  goto LAB_001358c7;
LAB_001359ea:
  iVar10 = 0;
  for (; (BVar14 & 1) == 0; BVar14 = BVar14 >> 1 | 0x8000000000000000) {
    iVar10 = iVar10 + 1;
  }
  iVar10 = iVar10 - (int)lVar12;
  goto LAB_0013580f;
}

Assistant:

auto HomomorphismModel::_build_distance3_graphs(vector<SVOBitset> & graph_rows, unsigned size, unsigned & idx,
        bool pattern) -> void
{
    for (unsigned v = 0; v < size; ++v) {
        auto nv = graph_rows[v * max_graphs + 0];
        graph_rows[v * max_graphs + idx] |= nv;
        for (auto c = nv.find_first(); c != decltype(nv)::npos; c = nv.find_first()) {
            nv.reset(c);
            auto nc = graph_rows[c * max_graphs + 0];
            graph_rows[v * max_graphs + idx] |= nc;
            for (auto w = nc.find_first(); w != decltype(nc)::npos; w = nc.find_first()) {
                nc.reset(w);
                // v--c--w so v is within distance 3 of w's neighbours
                graph_rows[v * max_graphs + idx] |= graph_rows[w * max_graphs + 0];
            }
        }
    }

    if (pattern)
        _imp->supplemental_graph_names.push_back("distance3");
    ++idx;
}